

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_preview.cpp
# Opt level: O2

void __thiscall QPreviewPaintEngine::QPreviewPaintEngine(QPreviewPaintEngine *this)

{
  long lVar1;
  QPreviewPaintEnginePrivate *this_00;
  
  this_00 = (QPreviewPaintEnginePrivate *)operator_new(0xe0);
  QPreviewPaintEnginePrivate::QPreviewPaintEnginePrivate(this_00);
  QPaintEngine::QPaintEngine(&this->super_QPaintEngine,this_00,0xfffeffff);
  *(undefined ***)this = &PTR__QPreviewPaintEngine_00164c60;
  (this->super_QPrintEngine)._vptr_QPrintEngine = (_func_int **)&PTR__QPreviewPaintEngine_00164d60;
  lVar1 = *(long *)&this->field_0x18;
  *(undefined8 *)(lVar1 + 0xd0) = 0;
  *(undefined8 *)(lVar1 + 0xd8) = 0;
  return;
}

Assistant:

QPreviewPaintEngine::QPreviewPaintEngine()
    : QPaintEngine(*(new QPreviewPaintEnginePrivate), PaintEngineFeatures(AllFeatures & ~ObjectBoundingModeGradients))
{
    Q_D(QPreviewPaintEngine);
    d->proxy_print_engine = nullptr;
    d->proxy_paint_engine = nullptr;
}